

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O1

void __thiscall Exttpose::Exttpose(Exttpose *this,Env *env_,ExttposeArgument *args_)

{
  value_type_conflict1 local_34;
  
  this->env = env_;
  this->args = args_;
  memset(&this->numfreq,0,0x110);
  DbaseCtrlBlk::init(&this->dcb,(EVP_PKEY_CTX *)args_);
  std::vector<int,_std::allocator<int>_>::resize(&this->itcnt,(long)this->args->DBASE_MAXITEM);
  local_34 = -1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->ocnt,(long)this->args->DBASE_MAXITEM,&local_34);
  std::vector<int,_std::allocator<int>_>::resize(&this->itlen,(long)this->args->DBASE_MAXITEM);
  std::vector<int,_std::allocator<int>_>::resize(&this->freqidx,(long)this->args->DBASE_MAXITEM);
  return;
}

Assistant:

Exttpose::Exttpose(Env &env_, ExttposeArgument &args_) : env(env_), args(args_) {
    dcb.init(args.input);
    itcnt.resize(args.DBASE_MAXITEM);
    ocnt.resize(args.DBASE_MAXITEM, -1);
    itlen.resize(args.DBASE_MAXITEM);
    freqidx.resize(args.DBASE_MAXITEM);
}